

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

QByteArray * qStringAsUcs2Le(QByteArray *__return_storage_ptr__,QString *src)

{
  Data *pDVar1;
  long lVar2;
  char16_t *pcVar3;
  char *pcVar4;
  long lVar5;
  QString *__range1;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(src->d).size * 2,'\0');
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  lVar2 = (src->d).size;
  if (lVar2 != 0) {
    pcVar3 = (src->d).ptr;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    lVar5 = 0;
    do {
      *(undefined2 *)(pcVar4 + lVar5) = *(undefined2 *)((long)pcVar3 + lVar5);
      lVar5 = lVar5 + 2;
    } while (lVar2 * 2 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

static QByteArray qStringAsUcs2Le(const QString& src)
{
    QByteArray rc(2*src.size(), 0);
    unsigned short *d = (unsigned short*)rc.data();
    for (QChar ch : src)
        *d++ = qToLittleEndian(quint16(ch.unicode()));

    return rc;
}